

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

bool __thiscall testing::internal::UnitTestImpl::RunAllTests(UnitTestImpl *this)

{
  InternalRunDeathTestFlag *pIVar1;
  TestEventRepeater *pTVar2;
  pointer ppEVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  TimeInMillis TVar7;
  UnitTestImpl *pUVar8;
  TestSuite *pTVar9;
  TestPartResult *pTVar10;
  TimeInMillis TVar11;
  uint uVar12;
  __normal_iterator<testing::Environment_**,_std::vector<testing::Environment_*,_std::allocator<testing::Environment_*>_>_>
  __tmp;
  TestResult *this_00;
  pointer ppEVar13;
  byte bVar14;
  int j;
  int i;
  ulong uVar15;
  allocator<char> local_71;
  uint local_70;
  uint local_6c;
  int local_68;
  uint local_64;
  vector<testing::Environment_*,_std::allocator<testing::Environment_*>_> *local_60;
  TimeInMillis local_58;
  char *local_50 [4];
  
  bVar4 = GTestIsInitialized();
  bVar14 = 1;
  if (g_help_flag == '\0') {
    PostFlagParsingInit(this);
    WriteToShardStatusFileIfNeeded();
    pIVar1 = (this->internal_run_death_test_flag_)._M_t.
             super___uniq_ptr_impl<testing::internal::InternalRunDeathTestFlag,_std::default_delete<testing::internal::InternalRunDeathTestFlag>_>
             ._M_t.
             super__Tuple_impl<0UL,_testing::internal::InternalRunDeathTestFlag_*,_std::default_delete<testing::internal::InternalRunDeathTestFlag>_>
             .super__Head_base<0UL,_testing::internal::InternalRunDeathTestFlag_*,_false>.
             _M_head_impl;
    bVar5 = ShouldShard("GTEST_TOTAL_SHARDS","GTEST_SHARD_INDEX",
                        pIVar1 != (InternalRunDeathTestFlag *)0x0);
    local_68 = FilterTests(this,(uint)!bVar5);
    if (FLAGS_gtest_list_tests == '\x01') {
      ListTestsMatchingFilter(this);
    }
    else {
      iVar6 = 0;
      if (FLAGS_gtest_shuffle == '\x01') {
        iVar6 = GetRandomSeedFromFlag(FLAGS_gtest_random_seed);
      }
      this->random_seed_ = iVar6;
      pTVar2 = (this->listeners_).repeater_;
      TVar7 = GetTimeInMillis();
      this->start_timestamp_ = TVar7;
      (*(pTVar2->super_TestEventListener)._vptr_TestEventListener[2])(pTVar2,this->parent_);
      local_70 = 1;
      if (pIVar1 == (InternalRunDeathTestFlag *)0x0) {
        local_70 = FLAGS_gtest_repeat;
      }
      local_60 = &this->environments_;
      uVar12 = 0;
      uVar15 = 0;
LAB_0011a622:
      if (uVar12 != local_70 || (int)local_70 < 0) {
        ClearNonAdHocTestResult(this);
        TVar7 = GetTimeInMillis();
        local_6c = uVar12;
        if (0 < local_68) {
          if (FLAGS_gtest_shuffle == '\x01') {
            (this->random_).state_ = this->random_seed_;
            ShuffleTests(this);
          }
          local_58 = TVar7;
          (*(pTVar2->super_TestEventListener)._vptr_TestEventListener[3])
                    (pTVar2,this->parent_,(ulong)uVar12);
          (*(pTVar2->super_TestEventListener)._vptr_TestEventListener[4])(pTVar2,this->parent_);
          ForEach<std::vector<testing::Environment*,std::allocator<testing::Environment*>>,void(*)(testing::Environment*)>
                    (local_60,SetUpEnvironment);
          (*(pTVar2->super_TestEventListener)._vptr_TestEventListener[5])(pTVar2,this->parent_);
          bVar5 = Test::IsSkipped();
          local_64 = (uint)uVar15;
          if (bVar5) {
            pUVar8 = GetUnitTestImpl();
            if (pUVar8->current_test_info_ == (TestInfo *)0x0) {
              if (pUVar8->current_test_suite_ == (TestSuite *)0x0) {
                this_00 = &pUVar8->ad_hoc_test_result_;
              }
              else {
                this_00 = &pUVar8->current_test_suite_->ad_hoc_test_result_;
              }
            }
            else {
              this_00 = &pUVar8->current_test_info_->result_;
            }
            for (iVar6 = 0;
                iVar6 < (int)(((long)(this_00->test_part_results_).
                                     super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this_00->test_part_results_).
                                    super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                                    ._M_impl.super__Vector_impl_data._M_start) / 0x70);
                iVar6 = iVar6 + 1) {
              pTVar10 = TestResult::GetTestPartResult(this_00,iVar6);
              if (pTVar10->type_ == kSkip) {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)local_50,(pTVar10->message_)._M_dataplus._M_p,&local_71);
                puts(local_50[0]);
                std::__cxx11::string::~string((string *)local_50);
              }
            }
            fflush(_stdout);
          }
          else {
            bVar5 = Test::HasFatalFailure();
            if (!bVar5) {
              iVar6 = 1;
              for (i = 0; i < (int)((ulong)((long)(this->test_suites_).
                                                  super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                           (long)(this->test_suites_).
                                                 super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>
                                                 ._M_impl.super__Vector_impl_data._M_start) >> 3);
                  i = i + 1) {
                pTVar9 = GetMutableSuiteCase(this,i);
                TestSuite::Run(pTVar9);
                if (FLAGS_gtest_fail_fast == '\x01') {
                  pTVar9 = GetMutableSuiteCase(this,i);
                  bVar5 = TestSuite::Failed(pTVar9);
                  if (bVar5) goto LAB_0011a778;
                }
                iVar6 = iVar6 + 1;
              }
            }
          }
          goto LAB_0011a818;
        }
        (*(pTVar2->super_TestEventListener)._vptr_TestEventListener[3])
                  (pTVar2,this->parent_,(ulong)uVar12);
        goto LAB_0011a865;
      }
      (*(pTVar2->super_TestEventListener)._vptr_TestEventListener[0x10])(pTVar2,this->parent_);
      if (!bVar4) {
        ColoredPrintf(kRed,
                      "\nIMPORTANT NOTICE - DO NOT IGNORE:\nThis test program did NOT call testing::InitGoogleTest() before calling RUN_ALL_TESTS(). This is INVALID. Soon Google Test will start to enforce the valid usage. Please fix it ASAP, or IT WILL START TO FAIL.\n"
                     );
      }
      bVar14 = (byte)uVar15 ^ 1;
    }
  }
  return (bool)(bVar14 & 1);
LAB_0011a778:
  for (; iVar6 < (int)((ulong)((long)(this->test_suites_).
                                     super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->test_suites_).
                                    super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 3);
      iVar6 = iVar6 + 1) {
    pTVar9 = GetMutableSuiteCase(this,iVar6);
    TestSuite::Skip(pTVar9);
  }
LAB_0011a818:
  (*(pTVar2->super_TestEventListener)._vptr_TestEventListener[0xd])(pTVar2,this->parent_);
  ppEVar3 = (this->environments_).
            super__Vector_base<testing::Environment_*,_std::allocator<testing::Environment_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  for (ppEVar13 = (this->environments_).
                  super__Vector_base<testing::Environment_*,_std::allocator<testing::Environment_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish; ppEVar13 != ppEVar3;
      ppEVar13 = ppEVar13 + -1) {
    (**(code **)(*(long *)ppEVar13[-1] + 0x18))();
  }
  (*(pTVar2->super_TestEventListener)._vptr_TestEventListener[0xe])(pTVar2,this->parent_);
  uVar15 = (ulong)local_64;
  TVar7 = local_58;
  uVar12 = local_6c;
LAB_0011a865:
  TVar11 = GetTimeInMillis();
  this->elapsed_time_ = TVar11 - TVar7;
  (*(pTVar2->super_TestEventListener)._vptr_TestEventListener[0xf])
            (pTVar2,this->parent_,(ulong)uVar12);
  bVar5 = Passed(this);
  UnshuffleTests(this);
  if (FLAGS_gtest_shuffle == '\x01') {
    iVar6 = GetNextRandomSeed(this->random_seed_);
    this->random_seed_ = iVar6;
  }
  uVar15 = CONCAT71((int7)(uVar15 >> 8),(byte)uVar15 | !bVar5);
  uVar12 = local_6c + 1;
  goto LAB_0011a622;
}

Assistant:

bool UnitTestImpl::RunAllTests() {
  // True if and only if Google Test is initialized before RUN_ALL_TESTS() is
  // called.
  const bool gtest_is_initialized_before_run_all_tests = GTestIsInitialized();

  // Do not run any test if the --help flag was specified.
  if (g_help_flag)
    return true;

  // Repeats the call to the post-flag parsing initialization in case the
  // user didn't call InitGoogleTest.
  PostFlagParsingInit();

  // Even if sharding is not on, test runners may want to use the
  // GTEST_SHARD_STATUS_FILE to query whether the test supports the sharding
  // protocol.
  internal::WriteToShardStatusFileIfNeeded();

  // True if and only if we are in a subprocess for running a thread-safe-style
  // death test.
  bool in_subprocess_for_death_test = false;

#if GTEST_HAS_DEATH_TEST
  in_subprocess_for_death_test =
      (internal_run_death_test_flag_.get() != nullptr);
# if defined(GTEST_EXTRA_DEATH_TEST_CHILD_SETUP_)
  if (in_subprocess_for_death_test) {
    GTEST_EXTRA_DEATH_TEST_CHILD_SETUP_();
  }
# endif  // defined(GTEST_EXTRA_DEATH_TEST_CHILD_SETUP_)
#endif  // GTEST_HAS_DEATH_TEST

  const bool should_shard = ShouldShard(kTestTotalShards, kTestShardIndex,
                                        in_subprocess_for_death_test);

  // Compares the full test names with the filter to decide which
  // tests to run.
  const bool has_tests_to_run = FilterTests(should_shard
                                              ? HONOR_SHARDING_PROTOCOL
                                              : IGNORE_SHARDING_PROTOCOL) > 0;

  // Lists the tests and exits if the --gtest_list_tests flag was specified.
  if (GTEST_FLAG(list_tests)) {
    // This must be called *after* FilterTests() has been called.
    ListTestsMatchingFilter();
    return true;
  }

  random_seed_ = GTEST_FLAG(shuffle) ?
      GetRandomSeedFromFlag(GTEST_FLAG(random_seed)) : 0;

  // True if and only if at least one test has failed.
  bool failed = false;

  TestEventListener* repeater = listeners()->repeater();

  start_timestamp_ = GetTimeInMillis();
  repeater->OnTestProgramStart(*parent_);

  // How many times to repeat the tests?  We don't want to repeat them
  // when we are inside the subprocess of a death test.
  const int repeat = in_subprocess_for_death_test ? 1 : GTEST_FLAG(repeat);
  // Repeats forever if the repeat count is negative.
  const bool gtest_repeat_forever = repeat < 0;
  for (int i = 0; gtest_repeat_forever || i != repeat; i++) {
    // We want to preserve failures generated by ad-hoc test
    // assertions executed before RUN_ALL_TESTS().
    ClearNonAdHocTestResult();

    const TimeInMillis start = GetTimeInMillis();

    // Shuffles test suites and tests if requested.
    if (has_tests_to_run && GTEST_FLAG(shuffle)) {
      random()->Reseed(static_cast<uint32_t>(random_seed_));
      // This should be done before calling OnTestIterationStart(),
      // such that a test event listener can see the actual test order
      // in the event.
      ShuffleTests();
    }

    // Tells the unit test event listeners that the tests are about to start.
    repeater->OnTestIterationStart(*parent_, i);

    // Runs each test suite if there is at least one test to run.
    if (has_tests_to_run) {
      // Sets up all environments beforehand.
      repeater->OnEnvironmentsSetUpStart(*parent_);
      ForEach(environments_, SetUpEnvironment);
      repeater->OnEnvironmentsSetUpEnd(*parent_);

      // Runs the tests only if there was no fatal failure or skip triggered
      // during global set-up.
      if (Test::IsSkipped()) {
        // Emit diagnostics when global set-up calls skip, as it will not be
        // emitted by default.
        TestResult& test_result =
            *internal::GetUnitTestImpl()->current_test_result();
        for (int j = 0; j < test_result.total_part_count(); ++j) {
          const TestPartResult& test_part_result =
              test_result.GetTestPartResult(j);
          if (test_part_result.type() == TestPartResult::kSkip) {
            const std::string& result = test_part_result.message();
            printf("%s\n", result.c_str());
          }
        }
        fflush(stdout);
      } else if (!Test::HasFatalFailure()) {
        for (int test_index = 0; test_index < total_test_suite_count();
             test_index++) {
          GetMutableSuiteCase(test_index)->Run();
          if (GTEST_FLAG(fail_fast) &&
              GetMutableSuiteCase(test_index)->Failed()) {
            for (int j = test_index + 1; j < total_test_suite_count(); j++) {
              GetMutableSuiteCase(j)->Skip();
            }
            break;
          }
        }
      }

      // Tears down all environments in reverse order afterwards.
      repeater->OnEnvironmentsTearDownStart(*parent_);
      std::for_each(environments_.rbegin(), environments_.rend(),
                    TearDownEnvironment);
      repeater->OnEnvironmentsTearDownEnd(*parent_);
    }

    elapsed_time_ = GetTimeInMillis() - start;

    // Tells the unit test event listener that the tests have just finished.
    repeater->OnTestIterationEnd(*parent_, i);

    // Gets the result and clears it.
    if (!Passed()) {
      failed = true;
    }

    // Restores the original test order after the iteration.  This
    // allows the user to quickly repro a failure that happens in the
    // N-th iteration without repeating the first (N - 1) iterations.
    // This is not enclosed in "if (GTEST_FLAG(shuffle)) { ... }", in
    // case the user somehow changes the value of the flag somewhere
    // (it's always safe to unshuffle the tests).
    UnshuffleTests();

    if (GTEST_FLAG(shuffle)) {
      // Picks a new random seed for each iteration.
      random_seed_ = GetNextRandomSeed(random_seed_);
    }
  }

  repeater->OnTestProgramEnd(*parent_);

  if (!gtest_is_initialized_before_run_all_tests) {
    ColoredPrintf(
        GTestColor::kRed,
        "\nIMPORTANT NOTICE - DO NOT IGNORE:\n"
        "This test program did NOT call " GTEST_INIT_GOOGLE_TEST_NAME_
        "() before calling RUN_ALL_TESTS(). This is INVALID. Soon " GTEST_NAME_
        " will start to enforce the valid usage. "
        "Please fix it ASAP, or IT WILL START TO FAIL.\n");  // NOLINT
#if GTEST_FOR_GOOGLE_
    ColoredPrintf(GTestColor::kRed,
                  "For more details, see http://wiki/Main/ValidGUnitMain.\n");
#endif  // GTEST_FOR_GOOGLE_
  }

  return !failed;
}